

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ExpandBlockReferences(DXFImporter *this,Block *bl,BlockMap *blocks_by_name)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pointer pIVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  PolyLine *pPVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer paVar11;
  aiVector3D *v;
  const_iterator cVar12;
  PolyLine *this_01;
  Logger *pLVar13;
  pointer paVar14;
  undefined8 *puVar15;
  pointer pIVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  shared_ptr<Assimp::DXF::PolyLine> pl_out;
  long *local_1e8;
  long local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  value_type local_1a8 [7];
  ios_base local_138 [264];
  
  pIVar16 = (bl->insertions).
            super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (bl->insertions).
           super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar16 != pIVar7) {
    do {
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::find(&blocks_by_name->_M_t,&pIVar16->name);
      if ((_Rb_tree_header *)cVar12._M_node == &(blocks_by_name->_M_t)._M_impl.super__Rb_tree_header
         ) {
        pLVar13 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[41]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [41])"DXF: Failed to resolve block reference: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pIVar16->name)._M_dataplus._M_p,
                   (pIVar16->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; skipping",10);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar13,(char *)local_1e8);
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        puVar8 = *(undefined8 **)(cVar12._M_node + 2);
        puVar9 = (undefined8 *)puVar8[1];
        for (puVar15 = (undefined8 *)*puVar8; puVar15 != puVar9; puVar15 = puVar15 + 2) {
          pPVar10 = (PolyLine *)*puVar15;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          this_01 = (PolyLine *)operator_new(0xa8);
          DXF::PolyLine::PolyLine(this_01,pPVar10);
          local_1a8[0].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = this_01;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DXF::PolyLine*>
                    (&local_1a8[0].
                      super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,this_01);
          fVar17 = *(float *)(puVar8 + 0xb) * *(float *)(puVar8 + 0xb) +
                   *(float *)(puVar8 + 10) * *(float *)(puVar8 + 10) +
                   *(float *)((long)puVar8 + 0x54) * *(float *)((long)puVar8 + 0x54);
          if (fVar17 < 0.0) {
            fVar17 = sqrtf(fVar17);
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          if (((((((fVar17 != 0.0) || (NAN(fVar17))) || (fVar17 = (pIVar16->scale).x, fVar17 != 1.0)
                 ) || ((NAN(fVar17) || (fVar17 = (pIVar16->scale).y, fVar17 != 1.0)))) ||
               ((NAN(fVar17) || ((fVar17 = (pIVar16->scale).z, fVar17 != 1.0 || (NAN(fVar17)))))))
              || (pIVar16->angle != 0.0)) || (NAN(pIVar16->angle))) {
LAB_00423b1a:
            local_1c8 = ZEXT416(*(uint *)(puVar8 + 10));
            fVar17 = *(float *)((long)puVar8 + 0x54);
            local_1b8 = ZEXT416(*(uint *)(puVar8 + 0xb));
            fVar18 = (pIVar16->scale).x;
            fVar22 = (pIVar16->scale).y;
            fVar27 = (pIVar16->scale).z;
            fVar1 = (pIVar16->pos).x;
            fVar2 = (pIVar16->pos).y;
            fVar3 = (pIVar16->pos).z;
            if ((pIVar16->angle != 0.0) || (NAN(pIVar16->angle))) {
              pLVar13 = DefaultLogger::get();
              Logger::warn(pLVar13,"DXF: BLOCK rotation not currently implemented");
            }
            paVar14 = ((local_1a8[0].
                        super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar11 = ((local_1a8[0].
                        super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->positions).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (paVar14 != paVar11) {
              fVar29 = -(float)local_1c8._0_4_ * 0.0;
              fVar19 = fVar18 + 0.0 + fVar29;
              fVar26 = fVar22 * 0.0 + 0.0;
              fVar25 = fVar29 + fVar26;
              fVar23 = fVar27 * 0.0 + 0.0;
              fVar29 = fVar29 + fVar23;
              fVar20 = fVar18 * 0.0 + 0.0 + 0.0;
              fVar18 = -fVar17 * 0.0;
              fVar21 = fVar18 + fVar20;
              fVar24 = fVar22 + 0.0 + fVar18;
              fVar18 = fVar18 + fVar23;
              fVar17 = 0.0 - fVar17;
              fVar22 = -(float)local_1b8._0_4_ * 0.0;
              fVar20 = fVar20 + fVar22;
              fVar26 = fVar26 + fVar22;
              fVar22 = fVar27 + 0.0 + fVar22;
              fVar23 = (0.0 - (float)local_1c8._0_4_) * 0.0;
              fVar28 = fVar17 * 0.0;
              fVar27 = (0.0 - (float)local_1b8._0_4_) * 0.0;
              do {
                fVar4 = paVar14->x;
                fVar5 = paVar14->y;
                fVar6 = paVar14->z;
                paVar14->x = (fVar19 * 0.0 + fVar25 * 0.0 + fVar29 + fVar23) * fVar6 +
                             (fVar19 + fVar25 * 0.0 + fVar29 * 0.0 + fVar23) * fVar4 +
                             (fVar19 * 0.0 + fVar25 + fVar29 * 0.0 + fVar23) * fVar5 +
                             fVar29 * fVar3 + fVar25 * fVar2 + fVar1 * fVar19 +
                             (0.0 - (float)local_1c8._0_4_);
                paVar14->y = (fVar21 * 0.0 + fVar24 * 0.0 + fVar18 + fVar28) * fVar6 +
                             (fVar21 + fVar24 * 0.0 + fVar18 * 0.0 + fVar28) * fVar4 +
                             (fVar21 * 0.0 + fVar24 + fVar18 * 0.0 + fVar28) * fVar5 +
                             fVar18 * fVar3 + fVar24 * fVar2 + fVar1 * fVar21 + fVar17;
                paVar14->z = fVar6 * (fVar20 * 0.0 + fVar26 * 0.0 + fVar22 + fVar27) +
                             fVar4 * (fVar20 + fVar26 * 0.0 + fVar22 * 0.0 + fVar27) +
                             fVar5 * (fVar20 * 0.0 + fVar26 + fVar22 * 0.0 + fVar27) +
                             fVar22 * fVar3 + fVar26 * fVar2 + fVar1 * fVar20 +
                             (0.0 - (float)local_1b8._0_4_);
                paVar14 = paVar14 + 1;
              } while (paVar14 != paVar11);
            }
          }
          else {
            fVar17 = (pIVar16->pos).x;
            fVar18 = (pIVar16->pos).y;
            fVar22 = (pIVar16->pos).z;
            fVar17 = fVar22 * fVar22 + fVar17 * fVar17 + fVar18 * fVar18;
            if (fVar17 < 0.0) {
              fVar17 = sqrtf(fVar17);
            }
            else {
              fVar17 = SQRT(fVar17);
            }
            if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_00423b1a;
          }
          std::
          vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
          ::push_back(&bl->lines,local_1a8);
          if (local_1a8[0].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8[0].
                       super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      pIVar16 = pIVar16 + 1;
    } while (pIVar16 != pIVar7);
  }
  return;
}

Assistant:

void DXFImporter::ExpandBlockReferences(DXF::Block& bl,const DXF::BlockMap& blocks_by_name) {
    for (const DXF::InsertBlock& insert : bl.insertions) {

        // first check if the referenced blocks exists ...
        const DXF::BlockMap::const_iterator it = blocks_by_name.find(insert.name);
        if (it == blocks_by_name.end()) {
            ASSIMP_LOG_ERROR_F("DXF: Failed to resolve block reference: ", insert.name,"; skipping" );
            continue;
        }

        // XXX this would be the place to implement recursive expansion if needed.
        const DXF::Block& bl_src = *(*it).second;

        for (std::shared_ptr<const DXF::PolyLine> pl_in : bl_src.lines) {
            std::shared_ptr<DXF::PolyLine> pl_out = std::shared_ptr<DXF::PolyLine>(new DXF::PolyLine(*pl_in));

            if (bl_src.base.Length() || insert.scale.x!=1.f || insert.scale.y!=1.f || insert.scale.z!=1.f || insert.angle || insert.pos.Length()) {
                // manual coordinate system transformation
                // XXX order
                aiMatrix4x4 trafo, tmp;
                aiMatrix4x4::Translation(-bl_src.base,trafo);
                trafo *= aiMatrix4x4::Scaling(insert.scale,tmp);
                trafo *= aiMatrix4x4::Translation(insert.pos,tmp);

                // XXX rotation currently ignored - I didn't find an appropriate sample model.
                if (insert.angle != 0.f) {
                    ASSIMP_LOG_WARN("DXF: BLOCK rotation not currently implemented");
                }

                for (aiVector3D& v : pl_out->positions) {
                    v *= trafo;
                }
            }

            bl.lines.push_back(pl_out);
        }
    }
}